

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParseTools.cpp
# Opt level: O0

char * Rml::XMLParseTools::FindTag(char *tag,char *string,bool closing_tag)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *local_68;
  char *tag_start;
  StringView local_50;
  byte local_39;
  char *pcStack_38;
  bool found_closing;
  char *ptr;
  size_t length;
  char *pcStack_20;
  bool closing_tag_local;
  char *string_local;
  char *tag_local;
  
  length._7_1_ = closing_tag;
  pcStack_20 = string;
  string_local = tag;
  ptr = (char *)strlen(tag);
  pcStack_38 = pcStack_20;
  local_39 = 0;
  do {
    if (*pcStack_38 == '\0') {
      return (char *)0x0;
    }
    iVar3 = tolower((int)*pcStack_38);
    if (iVar3 == *string_local) {
      StringView::StringView(&local_50,pcStack_38,pcStack_38 + (long)ptr);
      StringView::StringView((StringView *)&tag_start,string_local,string_local + (long)ptr);
      bVar1 = StringUtilities::StringCompareCaseInsensitive(local_50,_tag_start);
      local_68 = pcStack_38;
      if (bVar1) {
        while( true ) {
          local_68 = local_68 + -1;
          bVar1 = false;
          if (pcStack_20 < local_68) {
            bVar2 = StringUtilities::IsWhitespace(*local_68);
            bVar1 = true;
            if (!bVar2) {
              bVar1 = *local_68 == '/';
            }
          }
          if (!bVar1) break;
          if (*local_68 == '/') {
            local_39 = 1;
          }
        }
        if ((*local_68 == '<') && ((local_39 & 1) == (length._7_1_ & 1))) {
          return local_68;
        }
      }
    }
    pcStack_38 = pcStack_38 + 1;
  } while( true );
}

Assistant:

const char* XMLParseTools::FindTag(const char* tag, const char* string, bool closing_tag)
{
	const size_t length = strlen(tag);
	const char* ptr = string;
	bool found_closing = false;

	while (*ptr)
	{
		// Check if the first character matches
		if (tolower((*ptr)) == tag[0])
		{
			// If it does, check the whole word
			if (StringUtilities::StringCompareCaseInsensitive(StringView(ptr, ptr + length), StringView(tag, tag + length)))
			{
				// Check for opening <, loop back in the string skipping white space and forward slashes if
				// we're looking for the closing tag
				const char* tag_start = ptr - 1;
				while (tag_start > string && (StringUtilities::IsWhitespace(*tag_start) || *tag_start == '/'))
				{
					if (*tag_start == '/')
						found_closing = true;
					tag_start--;
				}

				// If the character we're looking at is a <, and found closing matches closing tag,
				// its the tag we're looking for
				if (*tag_start == '<' && found_closing == closing_tag)
					return tag_start;

				// Otherwise, keep looking
			}
		}
		ptr++;
	}

	return nullptr;
}